

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O0

void __thiscall Random_keys::mutacao(Random_keys *this,RK_Individual *ind)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  double peso2;
  double peso1;
  int k;
  int j_1;
  double peso;
  int j;
  int i;
  RK_Individual *ind_local;
  Random_keys *this_local;
  
  iVar1 = rand();
  if (iVar1 % 100 < 6) {
    iVar1 = rand();
    iVar2 = RK_Individual::getNumEdges(ind);
    iVar3 = rand();
    pdVar7 = RK_Individual::getWeights(ind);
    pdVar7[iVar1 % iVar2] = (double)(iVar3 % 100);
  }
  else if (iVar1 % 100 < 0x10) {
    iVar1 = rand();
    iVar2 = RK_Individual::getNumEdges(ind);
    iVar3 = rand();
    iVar4 = RK_Individual::getNumEdges(ind);
    iVar5 = rand();
    iVar6 = rand();
    pdVar7 = RK_Individual::getWeights(ind);
    pdVar7[iVar1 % iVar2] = (double)(iVar5 % 100);
    pdVar7 = RK_Individual::getWeights(ind);
    pdVar7[iVar3 % iVar4] = (double)(iVar6 % 100);
  }
  return;
}

Assistant:

void Random_keys::mutacao(RK_Individual *ind){
    int i = rand() % 100;
    if(i<=5){
        int j = rand() % ind->getNumEdges();
        double peso = rand() % RANGEPESO;
        ind->getWeights()[j] = peso;
    }
    else{
        if(i<=15){
            int j = rand() % ind->getNumEdges();
            int k = rand() % ind->getNumEdges();
            double peso1 = rand() % RANGEPESO;
            double peso2 = rand() % RANGEPESO;
            ind->getWeights()[j] = peso1;
            ind->getWeights()[k] = peso2;
        }
    }
}